

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O3

void __thiscall
INetwork::AddLink(INetwork *this,size_t preSynapticNeuronId,size_t postSynapticNeuronId,
                 Strength strength,Time delay)

{
  INeuron *this_00;
  INeuron *this_01;
  mapped_type *ppIVar1;
  ISynapse *synapse;
  size_t local_28;
  size_t local_20;
  
  local_28 = postSynapticNeuronId;
  local_20 = preSynapticNeuronId;
  ppIVar1 = std::
            map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
            ::operator[](&this->neuronMap,&local_20);
  this_00 = *ppIVar1;
  ppIVar1 = std::
            map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
            ::operator[](&this->neuronMap,&local_28);
  this_01 = *ppIVar1;
  synapse = (ISynapse *)operator_new(0x40);
  LifSynapse::LifSynapse
            ((LifSynapse *)synapse,true,strength,delay,(INeuron *)this_00,(INeuron *)this_01);
  INeuron::AddOutputSynapse(this_00,synapse);
  INeuron::AddInputSynapse(this_01,synapse);
  return;
}

Assistant:

void INetwork::AddLink( size_t preSynapticNeuronId, size_t postSynapticNeuronId,
                        SPIKING_NN::Strength strength, SPIKING_NN::Time delay )
{
    INeuron *prev = neuronMap[preSynapticNeuronId];
    INeuron *next = neuronMap[postSynapticNeuronId];
    ISynapse *synapsePtr = new LifSynapse( true, strength, delay, prev, next );
    prev->AddOutputSynapse( synapsePtr );
    next->AddInputSynapse( synapsePtr );
}